

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
V2Transport::GetMessageType_abi_cxx11_(Span<const_unsigned_char> *contents)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  ulong uVar4;
  size_type sVar5;
  uchar *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> SVar7;
  size_t msg_type_len;
  uint8_t first_byte;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  Span<const_unsigned_char> *in_stack_ffffffffffffff58;
  Span<const_unsigned_char> *this;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar8;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Span<const_unsigned_char> *local_70;
  uchar *local_50;
  size_t local_48;
  allocator<char> local_39;
  Span<const_unsigned_char> local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_ffffffffffffff48);
  if (sVar2 == 0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00);
  }
  else {
    pbVar3 = Span<const_unsigned_char>::operator[]
                       (in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
    bVar1 = *pbVar3;
    local_38 = Span<const_unsigned_char>::subspan
                         (in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
    *in_RSI = local_38.m_data;
    in_RSI[1] = local_38.m_size;
    if (bVar1 == 0) {
      sVar2 = Span<const_unsigned_char>::size
                        ((Span<const_unsigned_char> *)in_stack_ffffffffffffff48);
      if (sVar2 < 0xc) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00);
      }
      else {
        local_70 = (Span<const_unsigned_char> *)0x0;
        while( true ) {
          uVar8 = false;
          if (local_70 < (Span<const_unsigned_char> *)0xc) {
            puVar6 = Span<const_unsigned_char>::operator[]
                               (in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
            uVar8 = *puVar6 != '\0';
          }
          if ((bool)uVar8 == false) {
            __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Span<const_unsigned_char>::data
                            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff48);
            __a = &local_39;
            this = local_70;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (this_00,in_stack_ffffffffffffff70,CONCAT17(uVar8,in_stack_ffffffffffffff68),
                       __a);
            std::allocator<char>::~allocator(&local_39);
            goto LAB_0020b7c0;
          }
          pbVar3 = Span<const_unsigned_char>::operator[]
                             (in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
          if (*pbVar3 < 0x20) break;
          pbVar3 = Span<const_unsigned_char>::operator[]
                             (in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
          if (0x7f < *pbVar3) break;
          local_70 = (Span<const_unsigned_char> *)((long)&local_70->m_data + 1);
        }
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff48);
      }
    }
    else {
      uVar4 = (ulong)bVar1;
      sVar5 = std::size<std::array<std::__cxx11::string,33ul>>
                        ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_33UL>
                          *)in_stack_ffffffffffffff48);
      if (uVar4 < sVar5) {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_33UL>
        ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_33UL>
                      *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00);
      }
    }
  }
  goto LAB_0020b859;
LAB_0020b7c0:
  if ((Span<const_unsigned_char> *)0xb < local_70) goto LAB_0020b803;
  puVar6 = Span<const_unsigned_char>::operator[](this,(size_t)__t);
  if (*puVar6 != '\0') {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff48);
    goto LAB_0020b84c;
  }
  local_70 = (Span<const_unsigned_char> *)((long)&local_70->m_data + 1);
  goto LAB_0020b7c0;
LAB_0020b803:
  SVar7 = Span<const_unsigned_char>::subspan(this,(size_t)__t);
  local_50 = SVar7.m_data;
  *in_RSI = local_50;
  local_48 = SVar7.m_size;
  in_RSI[1] = local_48;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,__t);
LAB_0020b84c:
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
LAB_0020b859:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> V2Transport::GetMessageType(Span<const uint8_t>& contents) noexcept
{
    if (contents.size() == 0) return std::nullopt; // Empty contents
    uint8_t first_byte = contents[0];
    contents = contents.subspan(1); // Strip first byte.

    if (first_byte != 0) {
        // Short (1 byte) encoding.
        if (first_byte < std::size(V2_MESSAGE_IDS)) {
            // Valid short message id.
            return V2_MESSAGE_IDS[first_byte];
        } else {
            // Unknown short message id.
            return std::nullopt;
        }
    }

    if (contents.size() < CMessageHeader::COMMAND_SIZE) {
        return std::nullopt; // Long encoding needs 12 message type bytes.
    }

    size_t msg_type_len{0};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE && contents[msg_type_len] != 0) {
        // Verify that message type bytes before the first 0x00 are in range.
        if (contents[msg_type_len] < ' ' || contents[msg_type_len] > 0x7F) {
            return {};
        }
        ++msg_type_len;
    }
    std::string ret{reinterpret_cast<const char*>(contents.data()), msg_type_len};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE) {
        // Verify that message type bytes after the first 0x00 are also 0x00.
        if (contents[msg_type_len] != 0) return {};
        ++msg_type_len;
    }
    // Strip message type bytes of contents.
    contents = contents.subspan(CMessageHeader::COMMAND_SIZE);
    return ret;
}